

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O2

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteInitialGuesses
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *this)

{
  SingleSparseDblVecWrtFactory vwf;
  SingleSparseVecWrtFactory<int,_double> local_48;
  
  local_48.fmt_ = "x%d\t# initial guess\n";
  local_48.hdr_prn_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_48.hdr_prn_.super__Function_base._M_functor._8_8_ = 0;
  local_48.hdr_prn_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_48.hdr_prn_._M_invoker = (_Invoker_type)0x0;
  local_48.nInst_ = 0;
  local_48.nlw_ = this;
  NLFeeder_Easy::
  FeedInitialGuesses<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
            (this->feeder_,&local_48);
  std::_Function_base::~_Function_base(&local_48.hdr_prn_.super__Function_base);
  return;
}

Assistant:

void NLWriter2<Params>::WriteObjAdj(
    const std::string& namebase) {
  WriteStringVec2File(namebase + ".adj",
                      [this](StringFileWriter& w){
    feeder_.FeedObjAdj(w);
  });
}